

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfScanLineInputFile.cpp
# Opt level: O0

void __thiscall
Imf_2_5::ScanLineInputFile::rawPixelData
          (ScanLineInputFile *this,int firstScanLine,char **pixelData,int *pixelDataSize)

{
  ArgExc *this_00;
  reference ppLVar1;
  undefined8 *in_RDX;
  int in_ESI;
  long in_RDI;
  stringstream _iex_replace_s;
  BaseExc *e;
  int minY;
  Lock lock;
  int *in_stack_00000320;
  char **in_stack_00000328;
  int in_stack_00000334;
  Data *in_stack_00000338;
  InputStreamMutex *in_stack_00000340;
  undefined8 in_stack_fffffffffffffdf0;
  Lock *this_01;
  undefined4 in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffdfc;
  Lock *in_stack_fffffffffffffe00;
  
  IlmThread_2_5::Lock::Lock
            (in_stack_fffffffffffffe00,
             (Mutex *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
             SUB81((ulong)in_stack_fffffffffffffdf0 >> 0x38,0));
  if ((*(int *)(*(long *)(in_RDI + 8) + 0xa4) <= in_ESI) &&
     (in_ESI <= *(int *)(*(long *)(in_RDI + 8) + 0xa8))) {
    lineBufferMinY(in_ESI,*(int *)(*(long *)(in_RDI + 8) + 0xa4),
                   *(int *)(*(long *)(in_RDI + 8) + 0x130));
    this_01 = *(Lock **)(in_RDI + 8);
    std::
    vector<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
    ::operator[]((vector<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                  *)&this_01[0x11]._locked,0);
    anon_unknown_6::readPixelData
              (in_stack_00000340,in_stack_00000338,in_stack_00000334,in_stack_00000328,
               in_stack_00000320);
    ppLVar1 = std::
              vector<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
              ::operator[]((vector<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                            *)(*(long *)(in_RDI + 8) + 0x118),0);
    *in_RDX = ((*ppLVar1)->buffer)._data;
    IlmThread_2_5::Lock::~Lock(this_01);
    return;
  }
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::ArgExc::ArgExc(this_00,"Tried to read scan line outside the image file\'s data window.");
  __cxa_throw(this_00,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
}

Assistant:

void
ScanLineInputFile::rawPixelData (int firstScanLine,
				 const char *&pixelData,
				 int &pixelDataSize)
{
    try
    {
        Lock lock (*_streamData);

	if (firstScanLine < _data->minY || firstScanLine > _data->maxY)
	{
	    throw IEX_NAMESPACE::ArgExc ("Tried to read scan line outside "
			       "the image file's data window.");
	}

        int minY = lineBufferMinY
	    (firstScanLine, _data->minY, _data->linesInBuffer);

	readPixelData
	    (_streamData, _data, minY, _data->lineBuffers[0]->buffer, pixelDataSize);

	pixelData = _data->lineBuffers[0]->buffer;
    }
    catch (IEX_NAMESPACE::BaseExc &e)
    {
	REPLACE_EXC (e, "Error reading pixel data from image "
                 "file \"" << fileName() << "\". " << e.what());
	throw;
    }
}